

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.c
# Opt level: O3

_Bool testbufferedxor8(size_t size)

{
  undefined1 auVar1 [16];
  _Bool _Var2;
  uint64_t *keys;
  clock_t cVar3;
  clock_t cVar4;
  ulong uVar5;
  uint64_t uVar6;
  long lVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  xor8_t local_48;
  
  printf("testing buffered xor8 ");
  printf("size = %zu \n",size);
  dVar8 = (double)(size & 0xffffffff) * 1.23 + 32.0;
  uVar5 = (ulong)dVar8;
  uVar5 = ((long)(dVar8 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5) / 3;
  local_48.fingerprints = (uint8_t *)malloc(uVar5 * 3);
  if (local_48.fingerprints != (uint8_t *)0x0) {
    local_48.blockLength = uVar5;
  }
  keys = (uint64_t *)malloc(size * 8);
  auVar1 = _DAT_00107060;
  if (size != 0) {
    lVar7 = size - 1;
    auVar9._8_4_ = (int)lVar7;
    auVar9._0_8_ = lVar7;
    auVar9._12_4_ = (int)((ulong)lVar7 >> 0x20);
    uVar6 = 0;
    auVar9 = auVar9 ^ _DAT_00107060;
    auVar10 = _DAT_00107050;
    do {
      auVar11 = auVar10 ^ auVar1;
      if ((bool)(~(auVar11._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar11._0_4_ ||
                  auVar9._4_4_ < auVar11._4_4_) & 1)) {
        keys[uVar6] = uVar6;
      }
      if ((auVar11._12_4_ != auVar9._12_4_ || auVar11._8_4_ <= auVar9._8_4_) &&
          auVar11._12_4_ <= auVar9._12_4_) {
        keys[uVar6 + 1] = uVar6 + 1;
      }
      uVar6 = uVar6 + 2;
      lVar7 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 2;
      auVar10._8_8_ = lVar7 + 2;
    } while ((size + 1 & 0xfffffffffffffffe) != uVar6);
  }
  _Var2 = xor8_buffered_populate(keys,(uint32_t)size,&local_48);
  if (_Var2) {
    lVar7 = 5;
    do {
      cVar3 = clock();
      xor8_buffered_populate(keys,(uint32_t)size,&local_48);
      cVar4 = clock();
      printf("It took %f seconds to build an index over %zu values. \n",
             (double)(cVar4 - cVar3) / 1000000.0,size);
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
    free(local_48.fingerprints);
    free(keys);
  }
  return _Var2;
}

Assistant:

bool testbufferedxor8(size_t size) {
  printf("testing buffered xor8 ");
  printf("size = %zu \n", size);

  xor8_t filter;
  xor8_allocate((uint32_t)size, &filter);
  // we need some set of values
  uint64_t *big_set = (uint64_t *)malloc(sizeof(uint64_t) * size);
  for (size_t i = 0; i < size; i++) {
    big_set[i] = i; // we use contiguous values
  }
  // we construct the filter
  bool constructed = xor8_buffered_populate(big_set, (uint32_t)size, &filter); // warm the cache
  if(!constructed) { return false; }
  for (size_t times = 0; times < 5; times++) {
    clock_t t;
    t = clock();
    xor8_buffered_populate(big_set, (uint32_t)size, &filter);
    t = clock() - t;
    double time_taken = ((double)t) / CLOCKS_PER_SEC; // in seconds
    printf("It took %f seconds to build an index over %zu values. \n",
           time_taken, size);
  }
  xor8_free(&filter);
  free(big_set);
  return true;
}